

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitors.c
# Opt level: O0

void test_modes(GLFWmonitor *monitor)

{
  int height;
  uint uVar1;
  int iVar2;
  GLFWvidmode *pGVar3;
  char *pcVar4;
  char *pcVar5;
  GLFWmonitor *monitor_00;
  GLFWwindow *handle;
  double dVar6;
  uint local_48;
  uint local_44;
  GLFWvidmode current;
  GLFWvidmode *mode;
  GLFWvidmode *modes;
  GLFWwindow *window;
  int count;
  int i;
  GLFWmonitor *monitor_local;
  
  _count = monitor;
  pGVar3 = glfwGetVideoModes(monitor,(int *)&window);
  window._4_4_ = 0;
  do {
    if ((int)window <= (int)window._4_4_) {
      return;
    }
    current._16_8_ = pGVar3 + (int)window._4_4_;
    glfwWindowHint(0x21001,((GLFWvidmode *)current._16_8_)->redBits);
    glfwWindowHint(0x21002,*(int *)(current._16_8_ + 0xc));
    glfwWindowHint(0x21003,*(int *)(current._16_8_ + 0x10));
    glfwWindowHint(0x2100f,*(int *)(current._16_8_ + 0x14));
    uVar1 = window._4_4_;
    pcVar4 = glfwGetMonitorName(_count);
    pcVar5 = format_mode((GLFWvidmode *)current._16_8_);
    printf("Testing mode %u on monitor %s: %s\n",(ulong)uVar1,pcVar4,pcVar5);
    iVar2 = *(int *)current._16_8_;
    height = *(int *)(current._16_8_ + 4);
    monitor_00 = glfwGetPrimaryMonitor();
    handle = glfwCreateWindow(iVar2,height,"Video Mode Test",monitor_00,(GLFWwindow *)0x0);
    uVar1 = window._4_4_;
    if (handle == (GLFWwindow *)0x0) {
      pcVar4 = format_mode((GLFWvidmode *)current._16_8_);
      printf("Failed to enter mode %u: %s\n",(ulong)uVar1,pcVar4);
    }
    else {
      glfwSetFramebufferSizeCallback(handle,framebuffer_size_callback);
      glfwSetKeyCallback(handle,key_callback);
      glfwMakeContextCurrent(handle);
      gladLoadGL(glfwGetProcAddress);
      glfwSwapInterval(1);
      glfwSetTime(0.0);
      while (dVar6 = glfwGetTime(), dVar6 < 5.0) {
        (*glad_glClear)(0x4000);
        glfwSwapBuffers(handle);
        glfwPollEvents();
        iVar2 = glfwWindowShouldClose(handle);
        if (iVar2 != 0) {
          printf("User terminated program\n");
          glfwTerminate();
          exit(0);
        }
      }
      (*glad_glGetIntegerv)(0xd52,&current.width);
      (*glad_glGetIntegerv)(0xd53,&current.height);
      (*glad_glGetIntegerv)(0xd54,&current.redBits);
      glfwGetWindowSize(handle,(int *)&local_48,(int *)&local_44);
      if (((current.width != *(int *)(current._16_8_ + 8)) ||
          (current.height != *(int *)(current._16_8_ + 0xc))) ||
         (current.redBits != *(int *)(current._16_8_ + 0x10))) {
        printf("*** Color bit mismatch: (%i %i %i) instead of (%i %i %i)\n",
               (ulong)(uint)current.width,(ulong)(uint)current.height,(ulong)(uint)current.redBits,
               (ulong)*(uint *)(current._16_8_ + 8),(ulong)*(uint *)(current._16_8_ + 0xc),
               *(undefined4 *)(current._16_8_ + 0x10));
      }
      if ((local_48 != *(uint *)current._16_8_) || (local_44 != *(uint *)(current._16_8_ + 4))) {
        printf("*** Size mismatch: %ix%i instead of %ix%i\n",(ulong)local_48,(ulong)local_44,
               (ulong)*(uint *)current._16_8_,(ulong)*(uint *)(current._16_8_ + 4));
      }
      printf("Closing window\n");
      glfwDestroyWindow(handle);
      glfwPollEvents();
    }
    window._4_4_ = window._4_4_ + 1;
  } while( true );
}

Assistant:

static void test_modes(GLFWmonitor* monitor)
{
    int i, count;
    GLFWwindow* window;
    const GLFWvidmode* modes = glfwGetVideoModes(monitor, &count);

    for (i = 0;  i < count;  i++)
    {
        const GLFWvidmode* mode = modes + i;
        GLFWvidmode current;

        glfwWindowHint(GLFW_RED_BITS, mode->redBits);
        glfwWindowHint(GLFW_GREEN_BITS, mode->greenBits);
        glfwWindowHint(GLFW_BLUE_BITS, mode->blueBits);
        glfwWindowHint(GLFW_REFRESH_RATE, mode->refreshRate);

        printf("Testing mode %u on monitor %s: %s\n",
               (unsigned int) i,
               glfwGetMonitorName(monitor),
               format_mode(mode));

        window = glfwCreateWindow(mode->width, mode->height,
                                  "Video Mode Test",
                                  glfwGetPrimaryMonitor(),
                                  NULL);
        if (!window)
        {
            printf("Failed to enter mode %u: %s\n",
                   (unsigned int) i,
                   format_mode(mode));
            continue;
        }

        glfwSetFramebufferSizeCallback(window, framebuffer_size_callback);
        glfwSetKeyCallback(window, key_callback);

        glfwMakeContextCurrent(window);
        gladLoadGL(glfwGetProcAddress);
        glfwSwapInterval(1);

        glfwSetTime(0.0);

        while (glfwGetTime() < 5.0)
        {
            glClear(GL_COLOR_BUFFER_BIT);
            glfwSwapBuffers(window);
            glfwPollEvents();

            if (glfwWindowShouldClose(window))
            {
                printf("User terminated program\n");

                glfwTerminate();
                exit(EXIT_SUCCESS);
            }
        }

        glGetIntegerv(GL_RED_BITS, &current.redBits);
        glGetIntegerv(GL_GREEN_BITS, &current.greenBits);
        glGetIntegerv(GL_BLUE_BITS, &current.blueBits);

        glfwGetWindowSize(window, &current.width, &current.height);

        if (current.redBits != mode->redBits ||
            current.greenBits != mode->greenBits ||
            current.blueBits != mode->blueBits)
        {
            printf("*** Color bit mismatch: (%i %i %i) instead of (%i %i %i)\n",
                   current.redBits, current.greenBits, current.blueBits,
                   mode->redBits, mode->greenBits, mode->blueBits);
        }

        if (current.width != mode->width || current.height != mode->height)
        {
            printf("*** Size mismatch: %ix%i instead of %ix%i\n",
                   current.width, current.height,
                   mode->width, mode->height);
        }

        printf("Closing window\n");

        glfwDestroyWindow(window);
        window = NULL;

        glfwPollEvents();
    }
}